

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::InteractionStorageBuffers2<glcts::ArraysOfArrays::Interface::GL>::
execute_draw_test(InteractionStorageBuffers2<glcts::ArraysOfArrays::Interface::GL> *this,
                 TestShaderType tested_shader_type)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestError *this_00;
  undefined4 local_24;
  long lStack_20;
  GLuint vao_id;
  Functions *gl;
  InteractionStorageBuffers2<glcts::ArraysOfArrays::Interface::GL> *pIStack_10;
  TestShaderType tested_shader_type_local;
  InteractionStorageBuffers2<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  gl._4_4_ = tested_shader_type;
  pIStack_10 = this;
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>).
                      super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>.context_id);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  local_24 = 0;
  (**(code **)(lStack_20 + 0x708))(1,&local_24);
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"glGenVertexArrays() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x1d92);
  (**(code **)(lStack_20 + 0xd8))(local_24);
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"glBindVertexArray() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x1d95);
  if ((gl._4_4_ < COMPUTE_SHADER_TYPE) || (gl._4_4_ == GEOMETRY_SHADER_TYPE)) {
    (**(code **)(lStack_20 + 0x538))(0,0,1);
    dVar2 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar2,"glDrawArrays() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1d9d);
  }
  else {
    if (1 < gl._4_4_ - TESSELATION_CONTROL_SHADER_TYPE) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1dab);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (**(code **)(lStack_20 + 0xfd8))(0x8e72,1);
    dVar2 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar2,"PatchParameteri",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1da4);
    (**(code **)(lStack_20 + 0x538))(0xe,0,1);
    dVar2 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar2,"glDrawArrays() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1da7);
  }
  (**(code **)(lStack_20 + 0x490))(1,&local_24);
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"glDeleteVertexArrays() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x1db0);
  return;
}

Assistant:

void InteractionStorageBuffers2<API>::execute_draw_test(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	const glw::Functions& gl = this->context_id.getRenderContext().getFunctions();

	glw::GLuint vao_id = 0;

	gl.genVertexArrays(1, &vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() failed.");

	gl.bindVertexArray(vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() failed.");

	switch (tested_shader_type)
	{
	case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
	case TestCaseBase<API>::VERTEX_SHADER_TYPE: /* Fall through */
	case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
		gl.drawArrays(GL_POINTS, 0, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed.");
		break;

	case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE: /* Fall through */
	case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
		/* Tesselation patch set up */
		gl.patchParameteri(GL_PATCH_VERTICES, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "PatchParameteri");

		gl.drawArrays(GL_PATCHES, 0, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed.");
		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	gl.deleteVertexArrays(1, &vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteVertexArrays() failed.");
}